

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::EnumName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,EnumDescriptor *descriptor)

{
  FileDescriptor *this_00;
  FileDescriptor *file;
  EnumDescriptor *descriptor_00;
  allocator local_89;
  string local_88;
  undefined1 local_58 [8];
  string name;
  string prefix;
  EnumDescriptor *descriptor_local;
  
  this_00 = EnumDescriptor::file((EnumDescriptor *)this);
  FileClassPrefix_abi_cxx11_((string *)((long)&name.field_2 + 8),(objectivec *)this_00,file);
  ClassNameWorker_abi_cxx11_((string *)local_58,this,descriptor_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"_Enum",&local_89);
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,(string *)((long)&name.field_2 + 8),(string *)local_58,&local_88
             ,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string EnumName(const EnumDescriptor* descriptor) {
  // 1. Enum names are used as is (style calls for CamelCase, trust it).
  // 2. Check for reserved word at the every end and then suffix things.
  //      message Fixed {
  //        message Size {...}
  //        enum Mumble {...}
  //      ...
  //      }
  //    yields Fixed_Class, Fixed_Size.
  const std::string prefix = FileClassPrefix(descriptor->file());
  const std::string name = ClassNameWorker(descriptor);
  return SanitizeNameForObjC(prefix, name, "_Enum", NULL);
}